

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc.h
# Opt level: O0

void foreach_overlappable_nb_above
               (AV1_COMMON *cm,MACROBLOCKD *xd,int nb_max,overlappable_nb_visitor_t fun,
               void *fun_ctxt)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  code *in_RCX;
  int in_EDX;
  long in_RSI;
  AV1_COMMON *in_RDI;
  undefined8 in_R8;
  MB_MODE_INFO **above_mi;
  int above_mi_col;
  uint8_t mi_step;
  int end_col;
  MB_MODE_INFO **prev_row_mi;
  int mi_col;
  int nb_count;
  int num_planes;
  int local_5c;
  undefined8 *local_58;
  uint local_4c;
  byte local_45;
  int local_30;
  
  if ((*(byte *)(in_RSI + 0x1ec0) & 1) != 0) {
    iVar3 = av1_num_planes(in_RDI);
    local_30 = 0;
    uVar1 = *(uint *)(in_RSI + 4);
    lVar5 = *(long *)(in_RSI + 0x1eb8) + (long)(int)uVar1 * -8 + (long)*(int *)(in_RSI + 8) * -8;
    local_4c = uVar1;
    if ((int)(uVar1 + *(byte *)(in_RSI + 0x2074)) < (in_RDI->mi_params).mi_cols) {
      local_5c = uVar1 + *(byte *)(in_RSI + 0x2074);
    }
    else {
      local_5c = (in_RDI->mi_params).mi_cols;
    }
    for (; (int)local_4c < local_5c && local_30 < in_EDX; local_4c = local_45 + local_4c) {
      local_58 = (undefined8 *)(lVar5 + (long)(int)local_4c * 8);
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [*(byte *)*local_58] < 0x10) {
        local_45 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [*(byte *)*local_58];
      }
      else {
        local_45 = 0x10;
      }
      if (local_45 == 1) {
        local_4c = local_4c & 0xfffffffe;
        local_58 = (undefined8 *)(lVar5 + (long)(int)local_4c * 8 + 8);
        local_45 = 2;
      }
      iVar4 = is_neighbor_overlappable((MB_MODE_INFO *)0x6e7514);
      if (iVar4 != 0) {
        local_30 = local_30 + 1;
        bVar2 = local_45;
        if (*(byte *)(in_RSI + 0x2074) < local_45) {
          bVar2 = *(byte *)(in_RSI + 0x2074);
        }
        (*in_RCX)(in_RSI,0,local_4c - uVar1,bVar2,0,*local_58,in_R8,iVar3);
      }
    }
  }
  return;
}

Assistant:

static inline void foreach_overlappable_nb_above(const AV1_COMMON *cm,
                                                 MACROBLOCKD *xd, int nb_max,
                                                 overlappable_nb_visitor_t fun,
                                                 void *fun_ctxt) {
  if (!xd->up_available) return;

  const int num_planes = av1_num_planes(cm);
  int nb_count = 0;
  const int mi_col = xd->mi_col;
  // prev_row_mi points into the mi array, starting at the beginning of the
  // previous row.
  MB_MODE_INFO **prev_row_mi = xd->mi - mi_col - 1 * xd->mi_stride;
  const int end_col = AOMMIN(mi_col + xd->width, cm->mi_params.mi_cols);
  uint8_t mi_step;
  for (int above_mi_col = mi_col; above_mi_col < end_col && nb_count < nb_max;
       above_mi_col += mi_step) {
    MB_MODE_INFO **above_mi = prev_row_mi + above_mi_col;
    mi_step =
        AOMMIN(mi_size_wide[above_mi[0]->bsize], mi_size_wide[BLOCK_64X64]);
    // If we're considering a block with width 4, it should be treated as
    // half of a pair of blocks with chroma information in the second. Move
    // above_mi_col back to the start of the pair if needed, set above_mbmi
    // to point at the block with chroma information, and set mi_step to 2 to
    // step over the entire pair at the end of the iteration.
    if (mi_step == 1) {
      above_mi_col &= ~1;
      above_mi = prev_row_mi + above_mi_col + 1;
      mi_step = 2;
    }
    if (is_neighbor_overlappable(*above_mi)) {
      ++nb_count;
      fun(xd, 0, above_mi_col - mi_col, AOMMIN(xd->width, mi_step), 0,
          *above_mi, fun_ctxt, num_planes);
    }
  }
}